

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testStringReplace(void)

{
  C *pCVar1;
  String title;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff10;
  C *in_stack_ffffffffffffff18;
  StringRef *in_stack_ffffffffffffff20;
  StringRef *in_stack_ffffffffffffff28;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff30;
  
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (in_stack_ffffffffffffff30,(C *)in_stack_ffffffffffffff28,
             (size_t)in_stack_ffffffffffffff20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112c0a);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112c17);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112c60);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112c6a);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112cb3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112cbd);
  pCVar1 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     (in_stack_ffffffffffffff10);
  printf("title = %s\n",pCVar1);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x112cf1);
  return;
}

Assistant:

void
testStringReplace() {
	sl::String title = "contains: < (less-than) > (greater-than) & (ampersand)";
	title.replace("<", "&lt;");
	title.replace(">", "&gt;");
	title.replace("&", "&amp;");

	printf("title = %s\n", title.sz());
}